

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O2

int __thiscall deqp::gles2::Functional::ShaderApiTests::init(ShaderApiTests *this,EVP_PKEY_CTX *ctx)

{
  TestCaseGroup *pTVar1;
  CreateShaderCase *pCVar2;
  TestNode *pTVar3;
  CompileShaderCase *pCVar4;
  ShaderSourceReplaceCase *this_00;
  ShaderSourceSplitCase *this_01;
  int iVar5;
  int iVar6;
  char *pcVar7;
  bool bVar8;
  allocator<char> local_175;
  int numSlices;
  TestCaseGroup *local_170;
  Context *local_168;
  TestNode *local_160;
  string caseDesc;
  string caseDesc_2;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string caseName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  int local_4c;
  int local_48;
  deUint32 local_44;
  bool *local_40;
  bool *local_38;
  
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_context,"create_delete","glCreateShader() tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pCVar2 = (CreateShaderCase *)operator_new(0xa0);
  CreateShaderCase::CreateShaderCase
            (pCVar2,(this->super_TestCaseGroup).m_context,"create_vertex_shader",
             "Create vertex shader object",SHADERTYPE_VERTEX);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pCVar2);
  pCVar2 = (CreateShaderCase *)operator_new(0xa0);
  CreateShaderCase::CreateShaderCase
            (pCVar2,(this->super_TestCaseGroup).m_context,"create_fragment_shader",
             "Create fragment shader object",SHADERTYPE_FRAGMENT);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pCVar2);
  pTVar3 = (TestNode *)operator_new(0xa8);
  DeleteShaderCase::DeleteShaderCase
            ((DeleteShaderCase *)pTVar3,(this->super_TestCaseGroup).m_context,
             "delete_vertex_fragment","Delete vertex shader and fragment shader");
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar3);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_context,"compile_link","Compile and link tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pCVar4 = (CompileShaderCase *)operator_new(0xa0);
  CompileShaderCase::CompileShaderCase
            (pCVar4,(this->super_TestCaseGroup).m_context,"compile_vertex_shader",
             "Compile vertex shader",SHADERTYPE_VERTEX);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pCVar4);
  pCVar4 = (CompileShaderCase *)operator_new(0xa0);
  CompileShaderCase::CompileShaderCase
            (pCVar4,(this->super_TestCaseGroup).m_context,"compile_fragment_shader",
             "Compile fragment shader",SHADERTYPE_FRAGMENT);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pCVar4);
  pTVar3 = (TestNode *)operator_new(0xa8);
  LinkVertexFragmentCase::LinkVertexFragmentCase
            ((LinkVertexFragmentCase *)pTVar3,(this->super_TestCaseGroup).m_context,
             "link_vertex_fragment","Link vertex and fragment shaders");
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar3);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_context,"shader_source","glShaderSource() tests");
  local_170 = pTVar1;
  local_160 = (TestNode *)this;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  iVar6 = 2;
  while( true ) {
    if (iVar6 == 0) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&caseDesc,"replace_source",(allocator<char> *)&caseDesc_2);
    pcVar7 = "_vertex";
    if (iVar6 == 1) {
      pcVar7 = "_fragment";
    }
    std::operator+(&caseName,&caseDesc,pcVar7);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"Replace source code of ",(allocator<char> *)&local_70);
    pcVar7 = "Unexpected vertex";
    if (iVar6 == 1) {
      pcVar7 = "Vertex and fragment";
    }
    std::operator+(&caseDesc_2,&local_b0,pcVar7 + 0xb);
    std::operator+(&caseDesc,&caseDesc_2," shader.");
    std::__cxx11::string::~string((string *)&caseDesc_2);
    std::__cxx11::string::~string((string *)&local_b0);
    this_00 = (ShaderSourceReplaceCase *)operator_new(0xa0);
    ShaderSourceReplaceCase::ShaderSourceReplaceCase
              (this_00,(Context *)local_160[1]._vptr_TestNode,caseName._M_dataplus._M_p,
               caseDesc._M_dataplus._M_p,(uint)(iVar6 + -1 == 0));
    tcu::TestNode::addChild((TestNode *)local_170,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::__cxx11::string::~string((string *)&caseName);
    iVar6 = iVar6 + -1;
  }
  iVar6 = 0;
  while (iVar6 != 3) {
    bVar8 = iVar6 != 0;
    local_168 = (Context *)0x180e94b;
    if (bVar8) {
      local_168 = (Context *)0x180e93a;
    }
    local_40 = glcts::fixed_sample_locations_values + 1;
    local_38 = glcts::fixed_sample_locations_values + 1;
    if (bVar8) {
      local_38 = (bool *)0x180e97f;
    }
    local_44 = (uint)bVar8 + (uint)(iVar6 == 2) * 2;
    if (iVar6 == 2) {
      local_168 = (Context *)0x180e922;
      local_40 = (bool *)0x180e9ab;
    }
    iVar5 = 1;
    local_4c = iVar6;
    while (iVar5 != 4) {
      local_48 = iVar5;
      iVar6 = 2;
      while( true ) {
        if (iVar6 == 0) break;
        numSlices = 1 << ((byte)iVar5 & 0x1f);
        de::toString<int>(&local_b0,&numSlices);
        std::operator+(&caseDesc_2,"split_source_",&local_b0);
        std::operator+(&caseDesc,&caseDesc_2,(char *)local_168);
        pcVar7 = "_vertex";
        if (iVar6 == 1) {
          pcVar7 = "_fragment";
        }
        std::operator+(&caseName,&caseDesc,pcVar7);
        std::__cxx11::string::~string((string *)&caseDesc);
        std::__cxx11::string::~string((string *)&caseDesc_2);
        std::__cxx11::string::~string((string *)&local_b0);
        pcVar7 = "Vertex";
        if (iVar6 == 1) {
          pcVar7 = "Fragment";
        }
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,pcVar7,&local_175);
        std::operator+(&local_90,&local_f0," shader source split into ");
        de::toString<int>(&local_110,&numSlices);
        std::operator+(&local_70,&local_90,&local_110);
        std::operator+(&local_b0,&local_70," pieces");
        std::operator+(&caseDesc_2,&local_b0,local_38);
        std::operator+(&caseDesc,&caseDesc_2,local_40);
        std::__cxx11::string::~string((string *)&caseDesc_2);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_f0);
        this_01 = (ShaderSourceSplitCase *)operator_new(0xb8);
        ShaderSourceSplitCase::ShaderSourceSplitCase
                  (this_01,(Context *)local_160[1]._vptr_TestNode,caseName._M_dataplus._M_p,
                   caseDesc._M_dataplus._M_p,(uint)(iVar6 + -1 == 0),numSlices,local_44);
        tcu::TestNode::addChild((TestNode *)local_170,(TestNode *)this_01);
        std::__cxx11::string::~string((string *)&caseDesc);
        std::__cxx11::string::~string((string *)&caseName);
        iVar6 = iVar6 + -1;
      }
      iVar5 = local_48 + 1;
    }
    iVar6 = local_4c + 1;
  }
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  pTVar3 = local_160;
  TestCaseGroup::TestCaseGroup
            (pTVar1,(Context *)local_160[1]._vptr_TestNode,"program_state",
             "Program state persistence tests");
  tcu::TestNode::addChild(pTVar3,(TestNode *)pTVar1);
  local_168 = (Context *)pTVar3[1]._vptr_TestNode;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"detach_shader",(allocator<char> *)&numSlices);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"detach shader",&local_175);
  iVar6 = 2;
  while( true ) {
    iVar5 = iVar6 + -1;
    if (iVar6 == 0) break;
    local_170 = (TestCaseGroup *)CONCAT44(local_170._4_4_,iVar5);
    pcVar7 = glu::getShaderTypeName((uint)(iVar5 == 0));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&caseName,pcVar7,(allocator<char> *)&caseDesc);
    std::operator+(&caseDesc_2,&local_f0,"_");
    std::operator+(&caseDesc,&caseDesc_2,&caseName);
    std::__cxx11::string::~string((string *)&caseDesc_2);
    std::operator+(&local_90,"Build program, ",&local_110);
    std::operator+(&local_70,&local_90,", for ");
    std::operator+(&local_b0,&local_70,&caseName);
    std::operator+(&caseDesc_2,&local_b0," shader.");
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    pTVar3 = (TestNode *)operator_new(0xb0);
    ProgramStateDetachShaderCase::ProgramStateDetachShaderCase
              ((ProgramStateDetachShaderCase *)pTVar3,local_168,caseDesc._M_dataplus._M_p,
               caseDesc_2._M_dataplus._M_p,(uint)(iVar5 == 0));
    tcu::TestNode::addChild((TestNode *)pTVar1,pTVar3);
    std::__cxx11::string::~string((string *)&caseDesc_2);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::__cxx11::string::~string((string *)&caseName);
    iVar6 = (int)local_170;
  }
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  local_168 = (Context *)local_160[1]._vptr_TestNode;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"reattach_shader",(allocator<char> *)&numSlices);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"reattach shader",&local_175);
  iVar6 = 2;
  while( true ) {
    iVar5 = iVar6 + -1;
    if (iVar6 == 0) break;
    local_170 = (TestCaseGroup *)CONCAT44(local_170._4_4_,iVar5);
    pcVar7 = glu::getShaderTypeName((uint)(iVar5 == 0));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&caseName,pcVar7,(allocator<char> *)&caseDesc);
    std::operator+(&caseDesc_2,&local_f0,"_");
    std::operator+(&caseDesc,&caseDesc_2,&caseName);
    std::__cxx11::string::~string((string *)&caseDesc_2);
    std::operator+(&local_90,"Build program, ",&local_110);
    std::operator+(&local_70,&local_90,", for ");
    std::operator+(&local_b0,&local_70,&caseName);
    std::operator+(&caseDesc_2,&local_b0," shader.");
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    pTVar3 = (TestNode *)operator_new(0xb0);
    ProgramStateReattachShaderCase::ProgramStateReattachShaderCase
              ((ProgramStateReattachShaderCase *)pTVar3,local_168,caseDesc._M_dataplus._M_p,
               caseDesc_2._M_dataplus._M_p,(uint)(iVar5 == 0));
    tcu::TestNode::addChild((TestNode *)pTVar1,pTVar3);
    std::__cxx11::string::~string((string *)&caseDesc_2);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::__cxx11::string::~string((string *)&caseName);
    iVar6 = (int)local_170;
  }
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  local_168 = (Context *)local_160[1]._vptr_TestNode;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"delete_shader",(allocator<char> *)&numSlices);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"delete shader",&local_175);
  iVar6 = 2;
  while( true ) {
    iVar5 = iVar6 + -1;
    if (iVar6 == 0) break;
    local_170 = (TestCaseGroup *)CONCAT44(local_170._4_4_,iVar5);
    pcVar7 = glu::getShaderTypeName((uint)(iVar5 == 0));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&caseName,pcVar7,(allocator<char> *)&caseDesc);
    std::operator+(&caseDesc_2,&local_f0,"_");
    std::operator+(&caseDesc,&caseDesc_2,&caseName);
    std::__cxx11::string::~string((string *)&caseDesc_2);
    std::operator+(&local_90,"Build program, ",&local_110);
    std::operator+(&local_70,&local_90,", for ");
    std::operator+(&local_b0,&local_70,&caseName);
    std::operator+(&caseDesc_2,&local_b0," shader.");
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    pTVar3 = (TestNode *)operator_new(0xb0);
    ProgramStateDeleteShaderCase::ProgramStateDeleteShaderCase
              ((ProgramStateDeleteShaderCase *)pTVar3,local_168,caseDesc._M_dataplus._M_p,
               caseDesc_2._M_dataplus._M_p,(uint)(iVar5 == 0));
    tcu::TestNode::addChild((TestNode *)pTVar1,pTVar3);
    std::__cxx11::string::~string((string *)&caseDesc_2);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::__cxx11::string::~string((string *)&caseName);
    iVar6 = (int)local_170;
  }
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  local_168 = (Context *)local_160[1]._vptr_TestNode;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"replace_shader",(allocator<char> *)&numSlices);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"replace shader object",&local_175);
  iVar6 = 2;
  while( true ) {
    iVar5 = iVar6 + -1;
    if (iVar6 == 0) break;
    local_170 = (TestCaseGroup *)CONCAT44(local_170._4_4_,iVar5);
    pcVar7 = glu::getShaderTypeName((uint)(iVar5 == 0));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&caseName,pcVar7,(allocator<char> *)&caseDesc);
    std::operator+(&caseDesc_2,&local_f0,"_");
    std::operator+(&caseDesc,&caseDesc_2,&caseName);
    std::__cxx11::string::~string((string *)&caseDesc_2);
    std::operator+(&local_90,"Build program, ",&local_110);
    std::operator+(&local_70,&local_90,", for ");
    std::operator+(&local_b0,&local_70,&caseName);
    std::operator+(&caseDesc_2,&local_b0," shader.");
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    pTVar3 = (TestNode *)operator_new(0xb0);
    ProgramStateReplaceShaderCase::ProgramStateReplaceShaderCase
              ((ProgramStateReplaceShaderCase *)pTVar3,local_168,caseDesc._M_dataplus._M_p,
               caseDesc_2._M_dataplus._M_p,(uint)(iVar5 == 0));
    tcu::TestNode::addChild((TestNode *)pTVar1,pTVar3);
    std::__cxx11::string::~string((string *)&caseDesc_2);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::__cxx11::string::~string((string *)&caseName);
    iVar6 = (int)local_170;
  }
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  local_168 = (Context *)local_160[1]._vptr_TestNode;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"recompile_shader",(allocator<char> *)&numSlices);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"recompile shader",&local_175);
  iVar6 = 2;
  while( true ) {
    iVar5 = iVar6 + -1;
    if (iVar6 == 0) break;
    local_170 = (TestCaseGroup *)CONCAT44(local_170._4_4_,iVar5);
    pcVar7 = glu::getShaderTypeName((uint)(iVar5 == 0));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&caseName,pcVar7,(allocator<char> *)&caseDesc);
    std::operator+(&caseDesc_2,&local_f0,"_");
    std::operator+(&caseDesc,&caseDesc_2,&caseName);
    std::__cxx11::string::~string((string *)&caseDesc_2);
    std::operator+(&local_90,"Build program, ",&local_110);
    std::operator+(&local_70,&local_90,", for ");
    std::operator+(&local_b0,&local_70,&caseName);
    std::operator+(&caseDesc_2,&local_b0," shader.");
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    pTVar3 = (TestNode *)operator_new(0xb0);
    ProgramStateRecompileShaderCase::ProgramStateRecompileShaderCase
              ((ProgramStateRecompileShaderCase *)pTVar3,local_168,caseDesc._M_dataplus._M_p,
               caseDesc_2._M_dataplus._M_p,(uint)(iVar5 == 0));
    tcu::TestNode::addChild((TestNode *)pTVar1,pTVar3);
    std::__cxx11::string::~string((string *)&caseDesc_2);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::__cxx11::string::~string((string *)&caseName);
    iVar6 = (int)local_170;
  }
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  local_170 = (TestCaseGroup *)local_160[1]._vptr_TestNode;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"replace_source",(allocator<char> *)&numSlices);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"replace shader source",&local_175);
  iVar6 = 2;
  while( true ) {
    iVar5 = iVar6 + -1;
    if (iVar6 == 0) break;
    local_160 = (TestNode *)CONCAT44(local_160._4_4_,iVar5);
    pcVar7 = glu::getShaderTypeName((uint)(iVar5 == 0));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&caseName,pcVar7,(allocator<char> *)&caseDesc);
    std::operator+(&caseDesc_2,&local_f0,"_");
    std::operator+(&caseDesc,&caseDesc_2,&caseName);
    std::__cxx11::string::~string((string *)&caseDesc_2);
    std::operator+(&local_90,"Build program, ",&local_110);
    std::operator+(&local_70,&local_90,", for ");
    std::operator+(&local_b0,&local_70,&caseName);
    std::operator+(&caseDesc_2,&local_b0," shader.");
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    pTVar3 = (TestNode *)operator_new(0xb0);
    ProgramStateReplaceSourceCase::ProgramStateReplaceSourceCase
              ((ProgramStateReplaceSourceCase *)pTVar3,(Context *)local_170,
               caseDesc._M_dataplus._M_p,caseDesc_2._M_dataplus._M_p,(uint)(iVar5 == 0));
    tcu::TestNode::addChild((TestNode *)pTVar1,pTVar3);
    std::__cxx11::string::~string((string *)&caseDesc_2);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::__cxx11::string::~string((string *)&caseName);
    iVar6 = (int)local_160;
  }
  std::__cxx11::string::~string((string *)&local_110);
  iVar6 = std::__cxx11::string::~string((string *)&local_f0);
  return iVar6;
}

Assistant:

void ShaderApiTests::init (void)
{
	// create and delete shaders
	{
		TestCaseGroup* createDeleteGroup = new TestCaseGroup(m_context, "create_delete", "glCreateShader() tests");
		addChild(createDeleteGroup);

		createDeleteGroup->addChild(new CreateShaderCase(m_context,	"create_vertex_shader",		"Create vertex shader object",		glu::SHADERTYPE_VERTEX));
		createDeleteGroup->addChild(new CreateShaderCase(m_context,	"create_fragment_shader",	"Create fragment shader object",	glu::SHADERTYPE_FRAGMENT));

		createDeleteGroup->addChild(new DeleteShaderCase(m_context,	"delete_vertex_fragment",	"Delete vertex shader and fragment shader"));
	}

	// compile and link
	{
		TestCaseGroup* compileLinkGroup = new TestCaseGroup(m_context, "compile_link", "Compile and link tests");
		addChild(compileLinkGroup);

		compileLinkGroup->addChild(new CompileShaderCase(m_context,	"compile_vertex_shader",	"Compile vertex shader",	glu::SHADERTYPE_VERTEX));
		compileLinkGroup->addChild(new CompileShaderCase(m_context,	"compile_fragment_shader",	"Compile fragment shader",	glu::SHADERTYPE_FRAGMENT));

		compileLinkGroup->addChild(new LinkVertexFragmentCase(m_context,	"link_vertex_fragment",	"Link vertex and fragment shaders"));
	}

	// shader source
	{
		TestCaseGroup* shaderSourceGroup = new TestCaseGroup(m_context, "shader_source", "glShaderSource() tests");
		addChild(shaderSourceGroup);

		for (int shaderTypeInt = 0; shaderTypeInt < 2; shaderTypeInt++)
		{
			const glu::ShaderType	shaderType	= (shaderTypeInt == 1) ? glu::SHADERTYPE_FRAGMENT : glu::SHADERTYPE_VERTEX;

			const std::string		caseName	= std::string("replace_source") + ((shaderType == glu::SHADERTYPE_FRAGMENT) ? "_fragment" : "_vertex");
			const std::string		caseDesc	= std::string("Replace source code of ") + ((shaderType == glu::SHADERTYPE_FRAGMENT) ? "fragment" : "vertex") + " shader.";

			shaderSourceGroup->addChild(new ShaderSourceReplaceCase(m_context, caseName.c_str(), caseDesc.c_str(), shaderType));
		}

		for (int stringLengthsInt	= 0; stringLengthsInt < 3; stringLengthsInt++)
		for (int caseNdx = 1; caseNdx <= 3; caseNdx++)
		for (int shaderTypeInt = 0; shaderTypeInt < 2; shaderTypeInt++)
		{
			const int				numSlices		= 1 << caseNdx;
			const glu::ShaderType	shaderType		= (shaderTypeInt == 1) ? glu::SHADERTYPE_FRAGMENT : glu::SHADERTYPE_VERTEX;

			const bool				explicitLengths	= (stringLengthsInt != 0);
			const bool				randomNullTerm	= (stringLengthsInt == 2);

			const deUint32			flags			= (explicitLengths	? CASE_EXPLICIT_SOURCE_LENGTHS	: 0)
													| (randomNullTerm	? CASE_RANDOM_NULL_TERMINATED	: 0);

			const std::string		caseName		= "split_source_"
													+ de::toString(numSlices)
													+ (randomNullTerm ? "_random_negative_length" : (explicitLengths ? "_specify_lengths" : "_null_terminated"))
													+ ((shaderType == glu::SHADERTYPE_FRAGMENT) ? "_fragment" : "_vertex");

			const std::string		caseDesc		= std::string((shaderType == glu::SHADERTYPE_FRAGMENT) ? "Fragment" : "Vertex")
													+ " shader source split into "
													+ de::toString(numSlices)
													+ " pieces"
													+ (explicitLengths ? ", using explicitly specified string lengths" : "")
													+ (randomNullTerm ? " with random negative length values" : "");

			shaderSourceGroup->addChild(new ShaderSourceSplitCase(m_context, caseName.c_str(), caseDesc.c_str(), shaderType, numSlices, flags));
		}
	}

	// link status and infolog
	{
		TestCaseGroup* linkStatusGroup = new TestCaseGroup(m_context, "program_state", "Program state persistence tests");
		addChild(linkStatusGroup);

		addProgramStateCase<ProgramStateDetachShaderCase>		(linkStatusGroup,	m_context,	"detach_shader",	"detach shader");
		addProgramStateCase<ProgramStateReattachShaderCase>		(linkStatusGroup,	m_context,	"reattach_shader",	"reattach shader");
		addProgramStateCase<ProgramStateDeleteShaderCase>		(linkStatusGroup,	m_context,	"delete_shader",	"delete shader");
		addProgramStateCase<ProgramStateReplaceShaderCase>		(linkStatusGroup,	m_context,	"replace_shader",	"replace shader object");
		addProgramStateCase<ProgramStateRecompileShaderCase>	(linkStatusGroup,	m_context,	"recompile_shader",	"recompile shader");
		addProgramStateCase<ProgramStateReplaceSourceCase>		(linkStatusGroup,	m_context,	"replace_source",	"replace shader source");
	}
}